

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonarray.cpp
# Opt level: O2

QJsonValue * __thiscall
QJsonArray::takeAt(QJsonValue *__return_storage_ptr__,QJsonArray *this,qsizetype i)

{
  QCborContainerPrivate *pQVar1;
  long in_FS_OFFSET;
  QCborValue local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->a).d.ptr;
  if ((i < 0 || pQVar1 == (QCborContainerPrivate *)0x0) ||
     ((ulong)(pQVar1->elements).d.size <= (ulong)i)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QJsonValue::QJsonValue(__return_storage_ptr__,Undefined);
      return __return_storage_ptr__;
    }
  }
  else {
    detach(this,0);
    (__return_storage_ptr__->value).n = (qint64)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->value).container = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(__return_storage_ptr__->value).t = &DAT_aaaaaaaaaaaaaaaa;
    QCborContainerPrivate::extractAt(&local_40,(this->a).d.ptr,i);
    QJsonPrivate::Value::fromTrustedCbor(__return_storage_ptr__,&local_40);
    QCborValue::~QCborValue((QCborValue *)&local_40);
    QCborContainerPrivate::removeAt((this->a).d.ptr,i);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QJsonValue QJsonArray::takeAt(qsizetype i)
{
    if (!a || i < 0 || i >= a->elements.size())
        return QJsonValue(QJsonValue::Undefined);

    detach();
    const QJsonValue v = QJsonPrivate::Value::fromTrustedCbor(a->extractAt(i));
    a->removeAt(i);
    return v;
}